

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::ImageButton(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,
                       int frame_padding,ImVec4 *bg_col,ImVec4 *tint_col)

{
  ImGuiID count;
  int in_R8D;
  ImVec2 *in_R9;
  bool ret;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_00000060;
  ImVec2 *in_stack_00000068;
  ImTextureID in_stack_00000078;
  ImGuiID in_stack_00000080;
  ImVec4 *in_stack_00000090;
  float in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  ImGuiWindow *str;
  ImGuiContext *this;
  bool local_1;
  
  str = GImGui->CurrentWindow;
  if ((str->SkipItems & 1U) == 0) {
    this = GImGui;
    PushID((void *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    count = ImGuiWindow::GetID((ImGuiWindow *)this,(char *)str,
                               (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
                              );
    PopID();
    if (-1 < in_R8D) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffac,(float)in_R8D,(float)in_R8D);
      PushStyleVar(in_R8D,in_R9);
    }
    local_1 = ImageButtonEx(in_stack_00000080,in_stack_00000078,(ImVec2 *)tint_col,in_stack_00000068
                            ,in_stack_00000060,(ImVec4 *)user_texture_id,in_stack_00000090);
    if (-1 < in_R8D) {
      PopStyleVar(count);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::ImageButton(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, int frame_padding, const ImVec4& bg_col, const ImVec4& tint_col)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    // Default to using texture ID as ID. User can still push string/integer prefixes.
    PushID((void*)(intptr_t)user_texture_id);
    const ImGuiID id = window->GetID("#image");
    PopID();

    if (frame_padding >= 0)
        PushStyleVar(ImGuiStyleVar_FramePadding, ImVec2((float)frame_padding, (float)frame_padding));
    bool ret = ImageButtonEx(id, user_texture_id, size, uv0, uv1, bg_col, tint_col);
    if (frame_padding >= 0)
        PopStyleVar();
    return ret;
}